

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall sznet::TimerQueue::cancel(TimerQueue *this,TimerId timerId)

{
  EventLoop *this_00;
  _Any_data local_58;
  code *pcStack_48;
  code *pcStack_40;
  
  this_00 = this->m_loop;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  pcStack_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = operator_new(0x28);
  *(code **)local_58._M_unused._0_8_ = cancelInLoop;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(Timer **)((long)local_58._M_unused._0_8_ + 0x10) = timerId.m_timer;
  *(int64_t *)((long)local_58._M_unused._0_8_ + 0x18) = timerId.m_sequence;
  *(TimerQueue **)((long)local_58._M_unused._0_8_ + 0x20) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::TimerQueue::*(sznet::TimerQueue_*,_sznet::TimerId))(sznet::TimerId)>_>
               ::_M_invoke;
  pcStack_48 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::TimerQueue::*(sznet::TimerQueue_*,_sznet::TimerId))(sznet::TimerId)>_>
               ::_M_manager;
  net::EventLoop::runInLoop(this_00,(Functor *)&local_58);
  if (pcStack_48 != (code *)0x0) {
    (*pcStack_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void TimerQueue::cancel(TimerId timerId)
{
	m_loop->runInLoop(std::bind(&TimerQueue::cancelInLoop, this, timerId));
}